

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O2

int hexstring2data(char *arg,uchar *data,int maxdlen)

{
  byte bVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  sVar3 = strlen(arg);
  iVar6 = (int)sVar3;
  iVar4 = 1;
  if (iVar6 <= maxdlen * 2 && ((sVar3 & 1) == 0 && iVar6 != 0)) {
    uVar5 = 0;
    memset(data,0,(long)maxdlen);
    uVar7 = (ulong)(uint)(iVar6 >> 1);
    if (iVar6 >> 1 < 1) {
      uVar7 = uVar5;
    }
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      bVar1 = asc2nibble(arg[uVar5 * 2]);
      if (0xf < bVar1) {
        return 1;
      }
      data[uVar5] = bVar1 << 4;
      bVar2 = asc2nibble(arg[uVar5 * 2 + 1]);
      if (0xf < bVar2) {
        return 1;
      }
      data[uVar5] = bVar2 | bVar1 << 4;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int hexstring2data(char *arg, unsigned char *data, int maxdlen)
{
	int len = strlen(arg);
	int i;
	unsigned char tmp;

	if (!len || len % 2 || len > maxdlen * 2)
		return 1;

	memset(data, 0, maxdlen);

	for (i = 0; i < len / 2; i++) {
		tmp = asc2nibble(*(arg + (2 * i)));
		if (tmp > 0x0F)
			return 1;

		data[i] = (tmp << 4);

		tmp = asc2nibble(*(arg + (2 * i) + 1));
		if (tmp > 0x0F)
			return 1;

		data[i] |= tmp;
	}

	return 0;
}